

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

float * glfwGetJoystickAxes(int joy,int *count)

{
  int *count_local;
  float *pfStack_10;
  int joy_local;
  
  if (count != (int *)0x0) {
    *count = 0;
    if (_glfwInitialized == 0) {
      _glfwInputError(0x10001,(char *)0x0);
      pfStack_10 = (float *)0x0;
    }
    else if ((joy < 0) || (0xf < joy)) {
      _glfwInputError(0x10003,"Invalid joystick %i",(ulong)(uint)joy);
      pfStack_10 = (float *)0x0;
    }
    else {
      pfStack_10 = _glfwPlatformGetJoystickAxes(joy,count);
    }
    return pfStack_10;
  }
  __assert_fail("count != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Wei-Parker-Guo[P]PhongSphere/glfw-3.2.1/src/input.c"
                ,0x22e,"const float *glfwGetJoystickAxes(int, int *)");
}

Assistant:

GLFWAPI const float* glfwGetJoystickAxes(int joy, int* count)
{
    assert(count != NULL);
    *count = 0;

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    if (joy < 0 || joy > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick %i", joy);
        return NULL;
    }

    return _glfwPlatformGetJoystickAxes(joy, count);
}